

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# infinite_suite.cpp
# Opt level: O3

void api_suite::test_empty(void)

{
  infinite<double> filter;
  value_type local_c0 [1];
  value_type local_b8 [1];
  infinite<double> local_b0;
  
  local_b8[0] = 1.0;
  local_c0[0] = 1.0;
  trial::online::impulse::infinite<double>::infinite<1ul,1ul>(&local_b0,&local_b8,&local_c0,1.0);
  boost::detail::test_impl
            ("filter.empty()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/impulse/infinite_suite.cpp"
             ,0x1a,"void api_suite::test_empty()",
             local_b0.input.window.super_span<double,_18446744073709551615UL>.member.size == 0);
  trial::online::impulse::infinite<double>::push(&local_b0,1.0);
  boost::detail::test_impl
            ("!filter.empty()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/impulse/infinite_suite.cpp"
             ,0x1c,"void api_suite::test_empty()",
             local_b0.input.window.super_span<double,_18446744073709551615UL>.member.size != 0);
  if (local_b0.output.coefficients.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.output.coefficients.super__Vector_base<double,_std::allocator<double>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_b0.output.coefficients.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b0.output.coefficients.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_b0.output.window.super_vector<double,_std::allocator<double>_>.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(local_b0.output.window.super_vector<double,_std::allocator<double>_>.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b0.output.window.super_vector<double,_std::allocator<double>_>.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b0.output.window.super_vector<double,_std::allocator<double>_>.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_b0.input.coefficients.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.input.coefficients.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_b0.input.coefficients.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b0.input.coefficients.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_b0.input.window.super_vector<double,_std::allocator<double>_>.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(local_b0.input.window.super_vector<double,_std::allocator<double>_>.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b0.input.window.super_vector<double,_std::allocator<double>_>.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b0.input.window.super_vector<double,_std::allocator<double>_>.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void test_empty()
{
    impulse::infinite<double> filter({1.0}, {1.0});
    TRIAL_TEST(filter.empty());
    filter.push(1);
    TRIAL_TEST(!filter.empty());
}